

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCore.cpp
# Opt level: O2

bool __thiscall helics::zeromq::ZmqCoreSS::brokerConnect(ZmqCoreSS *this)

{
  bool bVar1;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  ZmqContextManager::startContext(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  bVar1 = NetworkCore<helics::zeromq::ZmqCommsSS,_(gmlc::networking::InterfaceTypes)0>::
          brokerConnect(&this->
                         super_NetworkCore<helics::zeromq::ZmqCommsSS,_(gmlc::networking::InterfaceTypes)0>
                       );
  return bVar1;
}

Assistant:

bool ZmqCoreSS::brokerConnect()
    {
        ZmqContextManager::startContext();
        return NetworkCore::brokerConnect();
    }